

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.hpp
# Opt level: O3

void __thiscall
libtorrent::piece_info_alert::piece_info_alert(piece_info_alert *this,piece_info_alert *param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer ppVar2;
  pointer pbVar3;
  
  (this->super_torrent_alert).super_alert.m_timestamp.__d.__r =
       (param_2->super_torrent_alert).super_alert.m_timestamp.__d.__r;
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var1 = (param_2->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_torrent_alert).handle.m_torrent.
  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_2->super_torrent_alert).handle.m_torrent.
       super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_torrent_alert).handle.m_torrent.
  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  (param_2->super_torrent_alert).handle.m_torrent.
  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (param_2->super_torrent_alert).handle.m_torrent.
  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_torrent_alert).m_name_idx.m_idx = (param_2->super_torrent_alert).m_name_idx.m_idx;
  (this->super_torrent_alert).m_alloc._M_data = (param_2->super_torrent_alert).m_alloc._M_data;
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__piece_info_alert_004de168;
  ppVar2 = (param_2->piece_info).
           super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->piece_info).
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->piece_info).
       super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->piece_info).
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  (this->piece_info).
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->piece_info).
       super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->piece_info).
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->piece_info).
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->piece_info).
  super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3 = (param_2->block_data).
           super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->block_data).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->block_data).
       super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->block_data).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar3;
  (this->block_data).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->block_data).
       super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->block_data).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->block_data).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->block_data).
  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

alert(alert&& rhs) noexcept = default;